

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::increase_elimination_bound(Internal *this)

{
  int64_t *piVar1;
  undefined1 *puVar2;
  int iVar3;
  pointer pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int idx;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  lVar7 = (this->lim).elimbound;
  lVar11 = (long)(this->opts).elimboundmax;
  if (lVar7 < lVar11) {
    lVar6 = 1;
    if (lVar7 != 0) {
      lVar6 = lVar7 * 2;
    }
    lVar5 = 0;
    if (-1 < lVar7) {
      lVar5 = lVar6;
    }
    lVar7 = lVar11;
    if (lVar5 < lVar11) {
      lVar7 = lVar5;
    }
    (this->lim).elimbound = lVar7;
    if (this->internal != (Internal *)0x0) {
      if (lVar5 < lVar11) {
        lVar11 = lVar5;
      }
      phase(this->internal,"elim-phase",(this->stats).elimphases,"new elimination bound %ld",lVar11)
      ;
    }
    iVar3 = *(this->vars).n;
    if (iVar3 != 0) {
      uVar9 = 1;
      do {
        iVar8 = (int)uVar9;
        uVar10 = (ulong)(uint)-iVar8;
        if (0 < iVar8) {
          uVar10 = uVar9;
        }
        pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((uint)pFVar4[uVar10] & 0x7000100) == 0x1000000) {
          piVar1 = &(this->stats).mark.elim;
          *piVar1 = *piVar1 + 1;
          puVar2 = &pFVar4[uVar10].field_0x1;
          *puVar2 = *puVar2 | 1;
        }
        uVar9 = (ulong)(iVar8 + 1);
      } while (iVar8 != iVar3);
    }
    report(this,'^',0);
    return;
  }
  return;
}

Assistant:

void Internal::increase_elimination_bound () {

  if (lim.elimbound >= opts.elimboundmax)
    return;

  if (lim.elimbound < 0)
    lim.elimbound = 0;
  else if (!lim.elimbound)
    lim.elimbound = 1;
  else
    lim.elimbound *= 2;

  if (lim.elimbound > opts.elimboundmax)
    lim.elimbound = opts.elimboundmax;

  PHASE ("elim-phase", stats.elimphases,
         "new elimination bound %" PRId64 "", lim.elimbound);

  // Now reschedule all active variables for elimination again.
  //
#ifdef LOGGING
  int count = 0;
#endif
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (flags (idx).elim)
      continue;
    mark_elim (idx);
#ifdef LOGGING
    count++;
#endif
  }
  LOG ("marked %d variables as elimination candidates", count);

  report ('^');
}